

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml_load_mmap.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  MemoryInput input;
  xml_parse_result result;
  xml_document doc;
  
  if (1 < argc) {
    MemoryInput::MemoryInput(&input,argv[1]);
    pugi::xml_document::xml_document(&doc);
    std::chrono::_V2::system_clock::now();
    pugi::xml_document::load_buffer(&result,&doc,input._buffer,input._size,0x74,encoding_auto);
    std::chrono::_V2::system_clock::now();
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar1);
    pugi::xml_document::~xml_document(&doc);
    MemoryInput::~MemoryInput(&input);
  }
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc < 2) return 0;
    MemoryInput input(argv[1]);

    pugi::xml_document doc;

    using namespace std::chrono;

    auto start = high_resolution_clock::now();

    pugi::xml_parse_result result = doc.load_buffer(input.buffer(), input.size());

    auto end = high_resolution_clock::now();;

    std::cout << duration_cast<milliseconds>(end - start).count() << std::endl;
}